

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

void insert<16000u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  byte bVar2;
  size_t sVar3;
  TrieNode<unsigned_char> *pTVar4;
  TrieNode<unsigned_char> *pTVar5;
  size_t depth;
  vector_brodnik<unsigned_char_*> *pvVar6;
  ulong uVar7;
  BurstSimple<unsigned_char> local_61;
  vector_brodnik<unsigned_char_*> *local_60;
  uchar *str;
  TrieNode<unsigned_char> *local_50;
  uchar **local_48;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  local_50 = root;
  local_48 = strings;
  local_40 = n;
  do {
    if (local_38 == local_40) {
      return;
    }
    str = local_48[local_38];
    bVar2 = get_char<unsigned_char>(str,0);
    pTVar5 = local_50;
    depth = 1;
    while( true ) {
      uVar7 = (ulong)bVar2;
      if (((pTVar5->is_trie).super__Base_bitset<4UL>._M_w[bVar2 >> 6] >> (uVar7 & 0x3f) & 1) == 0)
      break;
      if (uVar7 == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xdf,
                      "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 16000U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      pTVar5 = (TrieNode<unsigned_char> *)(pTVar5->buckets)._M_elems[uVar7];
      bVar2 = get_char<unsigned_char>(str,depth);
      depth = depth + 1;
    }
    pvVar6 = (vector_brodnik<unsigned_char_*> *)(pTVar5->buckets)._M_elems[uVar7];
    if (pvVar6 == (vector_brodnik<unsigned_char_*> *)0x0) {
      local_60 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
      vector_brodnik<unsigned_char_*>::vector_brodnik(local_60);
      (pTVar5->buckets)._M_elems[uVar7] = local_60;
      pvVar6 = local_60;
    }
    local_60 = pvVar6;
    vector_brodnik<unsigned_char_*>::push_back(pvVar6,&str);
    if (uVar7 != 0) {
      sVar3 = vector_brodnik<unsigned_char_*>::size(local_60);
      if (16000 < sVar3) {
        pTVar4 = BurstSimple<unsigned_char>::operator()(&local_61,local_60,depth);
        pvVar6 = local_60;
        (pTVar5->buckets)._M_elems[uVar7] = pTVar4;
        p_Var1 = (pTVar5->is_trie).super__Base_bitset<4UL>._M_w + (bVar2 >> 6);
        *p_Var1 = *p_Var1 | 1L << (bVar2 & 0x3f);
        vector_brodnik<unsigned_char_*>::~vector_brodnik(local_60);
        operator_delete(pvVar6);
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}